

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O1

void UpdateTeam(int pnum,int team,bool update)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uiTeam;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  char *pcVar7;
  Node *pNVar8;
  undefined8 *puVar9;
  FName local_34;
  
  lVar5 = (long)pnum;
  if ((((byte)dmflags2.Value & 0x10) != 0) &&
     ((alwaysapplydmflags.Value || (deathmatch.Value != 0)))) {
    puVar9 = (undefined8 *)
             ((ulong)(((&DAT_017e5e98)[lVar5 * 0xa8] - 1 & 0x203) * 0x18) +
             (&DAT_017e5e88)[lVar5 * 0x54]);
    do {
      puVar6 = puVar9;
      puVar9 = (undefined8 *)*puVar6;
    } while (*(int *)(puVar6 + 1) != 0x203);
    bVar3 = FTeam::IsValidTeam(&TeamLibrary,*(uint *)(puVar6[2] + 0x28));
    if (bVar3) {
      Printf("Team changing has been disabled!\n");
      return;
    }
  }
  bVar3 = FTeam::IsValidTeam(&TeamLibrary,team);
  puVar9 = (undefined8 *)
           ((ulong)(((&DAT_017e5e98)[lVar5 * 0xa8] - 1 & 0x203) * 0x18) +
           (&DAT_017e5e88)[lVar5 * 0x54]);
  do {
    puVar6 = puVar9;
    puVar9 = (undefined8 *)*puVar6;
  } while (*(int *)(puVar6 + 1) != 0x203);
  iVar4 = 0xff;
  if (bVar3) {
    iVar4 = team;
  }
  uVar1 = *(uint *)(puVar6[2] + 0x28);
  uiTeam = userinfo_t::TeamChanged((userinfo_t *)(&DAT_017e5e88 + lVar5 * 0x54),iVar4);
  if (update && uVar1 != uiTeam) {
    bVar3 = FTeam::IsValidTeam(&TeamLibrary,uiTeam);
    puVar9 = (undefined8 *)
             ((ulong)(((&DAT_017e5e98)[lVar5 * 0xa8] - 1 & 0x1ea) * 0x18) +
             (&DAT_017e5e88)[lVar5 * 0x54]);
    if (bVar3) {
      do {
        puVar6 = puVar9;
        puVar9 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x1ea);
      uVar2 = *(undefined8 *)(puVar6[2] + 0x28);
      pcVar7 = FTeam::GetName(Teams.Array + (int)uiTeam);
      Printf("%s joined the %s team\n",uVar2,pcVar7);
    }
    else {
      do {
        puVar6 = puVar9;
        puVar9 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x1ea);
      Printf("%s is now a loner\n",*(undefined8 *)(puVar6[2] + 0x28));
    }
  }
  R_BuildPlayerTranslation(pnum);
  if (StatusBar != (DBaseStatusBar *)0x0) {
    iVar4 = DBaseStatusBar::GetPlayer(StatusBar);
    if (iVar4 == pnum) {
      (*(StatusBar->super_DObject)._vptr_DObject[10])(StatusBar,&players + lVar5 * 0x54);
    }
  }
  bVar3 = FTeam::IsValidTeam(&TeamLibrary,uiTeam);
  if (!bVar3) {
    pNVar8 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::GetNode
                       ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *)
                        (&DAT_017e5e88 + lVar5 * 0x54),&local_34);
    FBaseCVar::SetGenericRep((pNVar8->Pair).Value,(UCVarValue)0xff,CVAR_Int);
  }
  return;
}

Assistant:

static void UpdateTeam (int pnum, int team, bool update)
{
	userinfo_t *info = &players[pnum].userinfo;

	if ((dmflags2 & DF2_NO_TEAM_SWITCH) && (alwaysapplydmflags || deathmatch) && TeamLibrary.IsValidTeam (info->GetTeam()))
	{
		Printf ("Team changing has been disabled!\n");
		return;
	}

	int oldteam;

	if (!TeamLibrary.IsValidTeam (team))
	{
		team = TEAM_NONE;
	}
	oldteam = info->GetTeam();
	team = info->TeamChanged(team);

	if (update && oldteam != team)
	{
		if (TeamLibrary.IsValidTeam (team))
			Printf ("%s joined the %s team\n", info->GetName(), Teams[team].GetName ());
		else
			Printf ("%s is now a loner\n", info->GetName());
	}
	// Let the player take on the team's color
	R_BuildPlayerTranslation (pnum);
	if (StatusBar != NULL && StatusBar->GetPlayer() == pnum)
	{
		StatusBar->AttachToPlayer (&players[pnum]);
	}
	// Double-check
	if (!TeamLibrary.IsValidTeam (team))
	{
		*static_cast<FIntCVar *>((*info)[NAME_Team]) = TEAM_NONE;
	}
}